

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O2

VirtualPage * __thiscall
sai::VirtualFileEntry::GetTablePage
          (VirtualPage *__return_storage_ptr__,VirtualFileEntry *this,size_t Index)

{
  shared_ptr<sai::ifstream> Stream;
  __shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  memset(__return_storage_ptr__,0,0x1000);
  std::__shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&this->FileStream);
  if (local_30._M_ptr != (element_type *)0x0) {
    std::istream::seekg((long)local_30._M_ptr,(_Ios_Seekdir)((Index & 0xffffffffffe00) << 0xc));
    std::istream::read((char *)local_30._M_ptr,(long)__return_storage_ptr__);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

VirtualPage VirtualFileEntry::GetTablePage(std::size_t Index) const
{
	VirtualPage TablePage = {};
	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		Stream->seekg(VirtualPage::NearestTableIndex(Index) * VirtualPage::PageSize, std::ios::beg);
		Stream->read(reinterpret_cast<char*>(TablePage.u8.data()), VirtualPage::PageSize);
	}
	return TablePage;
}